

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O1

U32 ZSTD_insertBt1(ZSTD_matchState_t *ms,ZSTD_compressionParameters *cParams,BYTE *ip,BYTE *iend,
                  U32 mls,U32 extDict)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  char cVar6;
  uint uVar7;
  ulong *puVar8;
  uint *puVar9;
  int iVar10;
  long lVar11;
  ulong *puVar12;
  uint uVar13;
  ulong *puVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  BYTE *pBVar18;
  U32 *pUVar19;
  bool bVar20;
  U32 dummy32;
  BYTE *pInLoopLimit;
  int local_c8;
  uint *local_c0;
  uint *local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  uint local_94;
  ulong local_90;
  BYTE *local_88;
  ulong *local_80;
  ulong local_78;
  BYTE *local_70;
  BYTE *local_68;
  BYTE *local_60;
  U32 *local_58;
  ulong *local_50;
  ulong *local_48;
  BYTE *local_40;
  ulong local_38;
  
  cVar6 = (char)cParams->hashLog;
  switch(mls) {
  case 5:
    lVar11 = -0x30e4432345000000;
    break;
  case 6:
    lVar11 = -0x30e4432340650000;
    break;
  case 7:
    lVar11 = -0x30e44323405a9d00;
    break;
  case 8:
    lVar11 = -0x30e44323485a9b9d;
    break;
  default:
    uVar4 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-cVar6 & 0x1fU));
    goto LAB_001b021a;
  }
  uVar4 = (ulong)(lVar11 * *(long *)ip) >> (-cVar6 & 0x3fU);
LAB_001b021a:
  pUVar19 = ms->chainTable;
  uVar13 = ~(-1 << ((char)cParams->chainLog - 1U & 0x1f));
  local_38 = (ulong)ms->hashTable[uVar4];
  local_88 = (ms->window).base;
  local_60 = (ms->window).dictBase;
  local_90 = (ulong)(ms->window).dictLimit;
  local_68 = local_60 + local_90;
  local_70 = local_88 + local_90;
  uVar15 = (int)ip - (int)local_88;
  local_78 = (ulong)uVar15;
  uVar7 = uVar15 - uVar13;
  local_a0 = 0;
  if (uVar15 < uVar13) {
    uVar7 = 0;
  }
  uVar1 = (ms->window).lowLimit;
  uVar2 = cParams->searchLog;
  ms->hashTable[uVar4] = uVar15;
  uVar4 = (ulong)((uVar15 & uVar13) * 2);
  local_b8 = pUVar19 + uVar4;
  iVar10 = 1 << ((byte)uVar2 & 0x1f);
  local_c0 = pUVar19 + uVar4 + 1;
  local_c8 = uVar15 + 9;
  local_80 = (ulong *)(iend + -7);
  local_48 = (ulong *)(iend + -3);
  local_50 = (ulong *)(iend + -1);
  local_b0 = 8;
  local_a8 = 0;
  local_58 = pUVar19;
  do {
    bVar20 = iVar10 == 0;
    iVar10 = iVar10 + -1;
    if ((bVar20) || ((uint)local_38 <= uVar1)) break;
    uVar4 = local_a0;
    if (local_a8 < local_a0) {
      uVar4 = local_a8;
    }
    uVar17 = local_38 & 0xffffffff;
    if ((extDict == 0) || (local_90 <= uVar17 + uVar4)) {
      puVar8 = (ulong *)(ip + uVar4);
      puVar12 = (ulong *)(local_88 + uVar17 + uVar4);
      puVar14 = puVar8;
      if (puVar8 < local_80) {
        uVar5 = *puVar8 ^ *puVar12;
        uVar16 = 0;
        if (uVar5 != 0) {
          for (; (uVar5 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
          }
        }
        uVar16 = uVar16 >> 3 & 0x1fffffff;
        if (*puVar12 == *puVar8) {
          do {
            puVar14 = puVar14 + 1;
            puVar12 = puVar12 + 1;
            if (local_80 <= puVar14) goto LAB_001b0424;
            uVar5 = *puVar14 ^ *puVar12;
            uVar16 = 0;
            if (uVar5 != 0) {
              for (; (uVar5 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
              }
            }
            uVar16 = (long)puVar14 + ((uVar16 >> 3 & 0x1fffffff) - (long)puVar8);
          } while (*puVar12 == *puVar14);
        }
      }
      else {
LAB_001b0424:
        if ((puVar14 < local_48) && ((int)*puVar12 == (int)*puVar14)) {
          puVar14 = (ulong *)((long)puVar14 + 4);
          puVar12 = (ulong *)((long)puVar12 + 4);
        }
        if ((puVar14 < local_50) && ((short)*puVar12 == (short)*puVar14)) {
          puVar14 = (ulong *)((long)puVar14 + 2);
          puVar12 = (ulong *)((long)puVar12 + 2);
        }
        if (puVar14 < iend) {
          puVar14 = (ulong *)((long)puVar14 + (ulong)((char)*puVar12 == (char)*puVar14));
        }
        uVar16 = (long)puVar14 - (long)puVar8;
      }
      uVar4 = uVar16 + uVar4;
      pBVar18 = local_88 + uVar17;
    }
    else {
      local_40 = local_60 + uVar17;
      sVar3 = ZSTD_count_2segments(ip + uVar4,local_40 + uVar4,iend,local_68,local_70);
      uVar4 = sVar3 + uVar4;
      pBVar18 = local_88 + uVar17;
      pUVar19 = local_58;
      if (uVar4 + uVar17 < local_90) {
        pBVar18 = local_40;
      }
    }
    uVar15 = (uint)local_38;
    if ((local_b0 < uVar4) && (local_b0 = uVar4, local_c8 - uVar15 < uVar4)) {
      local_c8 = (int)uVar4 + uVar15;
    }
    if (ip + uVar4 == iend) {
LAB_001b0525:
      bVar20 = false;
    }
    else {
      puVar9 = pUVar19 + (uVar15 & uVar13) * 2;
      if (pBVar18[uVar4] < ip[uVar4]) {
        *local_b8 = uVar15;
        local_a8 = uVar4;
        if (uVar15 <= uVar7) {
          local_b8 = &local_94;
          goto LAB_001b0525;
        }
        puVar9 = puVar9 + 1;
        local_b8 = puVar9;
      }
      else {
        *local_c0 = uVar15;
        local_c0 = puVar9;
        local_a0 = uVar4;
        if (uVar15 <= uVar7) {
          local_c0 = &local_94;
          goto LAB_001b0525;
        }
      }
      local_38 = (ulong)*puVar9;
      bVar20 = true;
    }
  } while (bVar20);
  *local_c0 = 0;
  *local_b8 = 0;
  if (local_b0 < 0x181) {
    uVar7 = (local_c8 - (int)local_78) - 8;
  }
  else {
    uVar7 = (int)local_b0 - 0x180;
    if (0xbf < uVar7) {
      uVar7 = 0xc0;
    }
  }
  return uVar7;
}

Assistant:

static U32 ZSTD_insertBt1(
                ZSTD_matchState_t* ms, ZSTD_compressionParameters const* cParams,
                const BYTE* const ip, const BYTE* const iend,
                U32 const mls, U32 const extDict)
{
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32 matchIndex = hashTable[h];
    size_t commonLengthSmaller=0, commonLengthLarger=0;
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const U32 dictLimit = ms->window.dictLimit;
    const BYTE* const dictEnd = dictBase + dictLimit;
    const BYTE* const prefixStart = base + dictLimit;
    const BYTE* match;
    const U32 current = (U32)(ip-base);
    const U32 btLow = btMask >= current ? 0 : current - btMask;
    U32* smallerPtr = bt + 2*(current&btMask);
    U32* largerPtr  = smallerPtr + 1;
    U32 dummy32;   /* to be nullified at the end */
    U32 const windowLow = ms->window.lowLimit;
    U32 matchEndIdx = current+8+1;
    size_t bestLength = 8;
    U32 nbCompares = 1U << cParams->searchLog;
#ifdef ZSTD_C_PREDICT
    U32 predictedSmall = *(bt + 2*((current-1)&btMask) + 0);
    U32 predictedLarge = *(bt + 2*((current-1)&btMask) + 1);
    predictedSmall += (predictedSmall>0);
    predictedLarge += (predictedLarge>0);
#endif /* ZSTD_C_PREDICT */

    DEBUGLOG(8, "ZSTD_insertBt1 (%u)", current);

    assert(ip <= iend-8);   /* required for h calculation */
    hashTable[h] = current;   /* Update Hash Table */

    while (nbCompares-- && (matchIndex > windowLow)) {
        U32* const nextPtr = bt + 2*(matchIndex & btMask);
        size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
        assert(matchIndex < current);

#ifdef ZSTD_C_PREDICT   /* note : can create issues when hlog small <= 11 */
        const U32* predictPtr = bt + 2*((matchIndex-1) & btMask);   /* written this way, as bt is a roll buffer */
        if (matchIndex == predictedSmall) {
            /* no need to check length, result known */
            *smallerPtr = matchIndex;
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
            matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            predictedSmall = predictPtr[1] + (predictPtr[1]>0);
            continue;
        }
        if (matchIndex == predictedLarge) {
            *largerPtr = matchIndex;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
            predictedLarge = predictPtr[0] + (predictPtr[0]>0);
            continue;
        }
#endif

        if ((!extDict) || (matchIndex+matchLength >= dictLimit)) {
            assert(matchIndex+matchLength >= dictLimit);   /* might be wrong if extDict is incorrectly set to 0 */
            match = base + matchIndex;
            matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
        } else {
            match = dictBase + matchIndex;
            matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
            if (matchIndex+matchLength >= dictLimit)
                match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
        }

        if (matchLength > bestLength) {
            bestLength = matchLength;
            if (matchLength > matchEndIdx - matchIndex)
                matchEndIdx = matchIndex + (U32)matchLength;
        }

        if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
            break;   /* drop , to guarantee consistency ; miss a bit of compression, but other solutions can corrupt tree */
        }

        if (match[matchLength] < ip[matchLength]) {  /* necessarily within buffer */
            /* match is smaller than current */
            *smallerPtr = matchIndex;             /* update smaller idx */
            commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            smallerPtr = nextPtr+1;               /* new "candidate" => larger than match, which was smaller than target */
            matchIndex = nextPtr[1];              /* new matchIndex, larger than previous and closer to current */
        } else {
            /* match is larger than current */
            *largerPtr = matchIndex;
            commonLengthLarger = matchLength;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
    }   }

    *smallerPtr = *largerPtr = 0;
    if (bestLength > 384) return MIN(192, (U32)(bestLength - 384));   /* speed optimization */
    assert(matchEndIdx > current + 8);
    return matchEndIdx - (current + 8);
}